

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::ComputeVersionedName
          (cmTarget *this,string *vName,string *prefix,string *base,string *suffix,string *name,
          char *version)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->IsApple == true) {
    std::operator+(&local_40,prefix,base);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,(string *)name);
  }
  std::__cxx11::string::_M_assign((string *)vName);
  std::__cxx11::string::~string((string *)&local_40);
  if (version != (char *)0x0) {
    std::__cxx11::string::append((char *)vName);
    std::__cxx11::string::append((char *)vName);
  }
  if (this->IsApple == true) {
    std::__cxx11::string::string((string *)&local_40,(string *)suffix);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::append((string *)vName);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmTarget::ComputeVersionedName(std::string& vName,
                                    std::string const& prefix,
                                    std::string const& base,
                                    std::string const& suffix,
                                    std::string const& name,
                                    const char* version) const
{
  vName = this->IsApple? (prefix+base) : name;
  if(version)
    {
    vName += ".";
    vName += version;
    }
  vName += this->IsApple? suffix : std::string();
}